

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::ExtPrivkey::DerivePrivkeyData
          (KeyData *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  Pubkey local_c8;
  undefined1 local_b0 [8];
  ByteData fingerprint;
  ExtPrivkey key;
  string *string_path_local;
  ExtPrivkey *this_local;
  
  DerivePrivkey((ExtPrivkey *)
                &fingerprint.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this,string_path);
  Privkey::GeneratePubkey(&local_c8,&this->privkey_,true);
  Pubkey::GetFingerprint((ByteData *)local_b0,&local_c8,4);
  Pubkey::~Pubkey(&local_c8);
  KeyData::KeyData(__return_storage_ptr__,
                   (ExtPrivkey *)
                   &fingerprint.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,string_path,(ByteData *)local_b0);
  ByteData::~ByteData((ByteData *)local_b0);
  ~ExtPrivkey((ExtPrivkey *)
              &fingerprint.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

KeyData ExtPrivkey::DerivePrivkeyData(const std::string& string_path) const {
  ExtPrivkey key = DerivePrivkey(string_path);
  auto fingerprint = privkey_.GeneratePubkey().GetFingerprint();
  return KeyData(key, string_path, fingerprint);
}